

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

void __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldInsertUint::ShaderBitfieldOperationCaseBitfieldInsertUint
          (ShaderBitfieldOperationCaseBitfieldInsertUint *this,Context *context,char *name,
          GLSLVersion glslVersion,Data *data,Data *insert,int offset,int bits,int components,
          char *testStatement)

{
  int local_3c;
  int i;
  Data *insert_local;
  Data *data_local;
  GLSLVersion glslVersion_local;
  char *name_local;
  Context *context_local;
  ShaderBitfieldOperationCaseBitfieldInsertUint *this_local;
  
  ShaderBitfieldOperationCase::ShaderBitfieldOperationCase
            (&this->super_ShaderBitfieldOperationCase,context,name,"",glslVersion,data,testStatement
            );
  (this->super_ShaderBitfieldOperationCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__ShaderBitfieldOperationCaseBitfieldInsertUint_0324d2d0;
  this->m_components = components;
  for (local_3c = 0; local_3c < components; local_3c = local_3c + 1) {
    (this->super_ShaderBitfieldOperationCase).m_data.in2Uvec4[local_3c] = insert->inUvec4[local_3c];
  }
  if (0x20 < offset + bits) {
    offset = 0x20 - bits;
  }
  (this->super_ShaderBitfieldOperationCase).m_data.offset = offset;
  (this->super_ShaderBitfieldOperationCase).m_data.bits = bits;
  return;
}

Assistant:

ShaderBitfieldOperationCaseBitfieldInsertUint(Context& context, const char* name, glu::GLSLVersion glslVersion,
												  Data const& data, Data const& insert, int offset, int bits,
												  int components, char const* testStatement)
		: ShaderBitfieldOperationCase(context, name, "", glslVersion, data, testStatement), m_components(components)
	{
		for (int i = 0; i < components; ++i)
		{
			m_data.in2Uvec4[i] = insert.inUvec4[i];
		}
		if (offset + bits > 32)
		{
			offset -= (offset + bits) - 32;
		}
		m_data.offset = offset;
		m_data.bits   = bits;
	}